

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::sized_declarations_invalid_sizes4<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (sized_declarations_invalid_sizes4<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  long lVar1;
  allocator<char> local_11d;
  allocator<char> local_11c;
  allocator<char> local_11b;
  allocator<char> local_11a;
  allocator<char> local_119;
  string shader_source;
  string input [6];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)input,"    float x[2,2][2][2];\n",(allocator<char> *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 1),"    float x[2][2,2][2];\n",&local_119);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 2),"    float x[2][2][2,2];\n",&local_11a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 3),"    float x[2,2,2][2];\n",&local_11b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 4),"    float x[2][2,2,2];\n",&local_11c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 5),"    float x[2,2,2,2];\n",&local_11d);
  lVar1 = 0;
  do {
    if (lVar1 == 0xc0) {
      lVar1 = 0xa0;
      do {
        std::__cxx11::string::~string((string *)((long)&input[0]._M_dataplus._M_p + lVar1));
        lVar1 = lVar1 + -0x20;
      } while (lVar1 != -0x20);
      return;
    }
    shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
    shader_source._M_string_length = 0;
    shader_source.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::append((string *)&shader_source);
    std::__cxx11::string::append((string *)&shader_source);
    switch((ulong)tested_shader_type) {
    case 0:
    case 2:
    case 5:
      break;
    case 1:
      std::__cxx11::string::append((char *)&shader_source);
      break;
    case 4:
    case 3:
      std::__cxx11::string::append((string *)&shader_source);
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x774);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::append((string *)&shader_source);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[8])(this,(ulong)tested_shader_type,&shader_source);
    std::__cxx11::string::~string((string *)&shader_source);
    lVar1 = lVar1 + 0x20;
  } while( true );
}

Assistant:

void sized_declarations_invalid_sizes4<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string input[] = { "    float x[2,2][2][2];\n", "    float x[2][2,2][2];\n", "    float x[2][2][2,2];\n",
							"    float x[2,2,2][2];\n",  "    float x[2][2,2,2];\n",  "    float x[2,2,2,2];\n" };

	for (size_t string_index = 0; string_index < sizeof(input) / sizeof(input[0]); string_index++)
	{
		std::string shader_source;

		shader_source += shader_start;
		shader_source += input[string_index];

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		this->execute_negative_test(tested_shader_type, shader_source);
	} /* for (int string_index = 0; ...) */
}